

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t encoder_base64_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar10 = 0;
  while ((part->encstate).bufbeg < (part->encstate).bufend) {
    if (0x48 < (part->encstate).pos) {
      if (1 < size) {
        buffer[0] = '\r';
        buffer[1] = '\n';
        (part->encstate).pos = 0;
        buffer = buffer + 2;
        sVar10 = sVar10 + 2;
        size = size - 2;
        goto LAB_0010e81b;
      }
LAB_0010e8e1:
      bVar11 = true;
      if (sVar10 == 0) {
        return 0xfffffffffffffffe;
      }
      goto LAB_0010e8ed;
    }
LAB_0010e81b:
    if (size < 4) goto LAB_0010e8e1;
    sVar9 = (part->encstate).bufbeg;
    if ((part->encstate).bufend - sVar9 < 3) break;
    (part->encstate).bufbeg = sVar9 + 1;
    bVar2 = (part->encstate).buf[sVar9];
    (part->encstate).bufbeg = sVar9 + 2;
    uVar6 = (uint)(byte)(part->encstate).buf[sVar9 + 1] * 0x100;
    (part->encstate).bufbeg = sVar9 + 3;
    bVar3 = (part->encstate).buf[sVar9 + 2];
    *buffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 >> 2];
    buffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(uVar6 | (uint)bVar2 << 0x10) >> 0xc & 0x3f];
    buffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [uVar6 + bVar3 >> 6 & 0x3f];
    buffer[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
    buffer = buffer + 4;
    sVar10 = sVar10 + 4;
    (part->encstate).pos = (part->encstate).pos + 4;
    size = size - 4;
  }
  bVar11 = size < 4;
LAB_0010e8ed:
  sVar9 = sVar10;
  if (ateof) {
    if (bVar11) {
      sVar9 = 0xfffffffffffffffe;
      if (sVar10 != 0) {
        sVar9 = sVar10;
      }
    }
    else {
      buffer[2] = '=';
      buffer[3] = '=';
      sVar4 = (part->encstate).bufbeg;
      sVar5 = (part->encstate).bufend;
      if (sVar5 != sVar4) {
        uVar7 = 0;
        if (sVar5 - sVar4 == 2) {
          uVar7 = (ulong)(byte)(part->encstate).buf[sVar4 + 1] << 8;
        }
        uVar8 = (ulong)(byte)(part->encstate).buf[sVar4] << 0x10;
        *buffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8 >> 0x12];
        buffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(uint)((int)uVar8 + (int)uVar7) >> 0xc & 0x3f];
        sVar9 = (part->encstate).bufbeg + 1;
        (part->encstate).bufbeg = sVar9;
        if (sVar9 != (part->encstate).bufend) {
          buffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(uint)(uVar7 >> 6) & 0x3c];
          psVar1 = &(part->encstate).bufbeg;
          *psVar1 = *psVar1 + 1;
        }
        (part->encstate).pos = (part->encstate).pos + 4;
        sVar9 = sVar10 + 4;
      }
    }
  }
  return sVar9;
}

Assistant:

static size_t encoder_base64_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t cursize = 0;
  int i;
  char *ptr = buffer;

  while(st->bufbeg < st->bufend) {
    /* Line full ? */
    if(st->pos > MAX_ENCODED_LINE_LENGTH - 4) {
      /* Yes, we need 2 characters for CRLF. */
      if(size < 2) {
        if(!cursize)
          return STOP_FILLING;
        break;
      }
      *ptr++ = '\r';
      *ptr++ = '\n';
      st->pos = 0;
      cursize += 2;
      size -= 2;
    }

    /* Be sure there is enough space and input data for a base64 group. */
    if(size < 4) {
      if(!cursize)
        return STOP_FILLING;
      break;
    }
    if(st->bufend - st->bufbeg < 3)
      break;

    /* Encode three bytes as four characters. */
    i = st->buf[st->bufbeg++] & 0xFF;
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    *ptr++ = base64[(i >> 18) & 0x3F];
    *ptr++ = base64[(i >> 12) & 0x3F];
    *ptr++ = base64[(i >> 6) & 0x3F];
    *ptr++ = base64[i & 0x3F];
    cursize += 4;
    st->pos += 4;
    size -= 4;
  }

  /* If at eof, we have to flush the buffered data. */
  if(ateof) {
    if(size < 4) {
      if(!cursize)
        return STOP_FILLING;
    }
    else {
      /* Buffered data size can only be 0, 1 or 2. */
      ptr[2] = ptr[3] = '=';
      i = 0;

      /* If there is buffered data */
      if(st->bufend != st->bufbeg) {

        if(st->bufend - st->bufbeg == 2)
          i = (st->buf[st->bufbeg + 1] & 0xFF) << 8;

        i |= (st->buf[st->bufbeg] & 0xFF) << 16;
        ptr[0] = base64[(i >> 18) & 0x3F];
        ptr[1] = base64[(i >> 12) & 0x3F];
        if(++st->bufbeg != st->bufend) {
          ptr[2] = base64[(i >> 6) & 0x3F];
          st->bufbeg++;
        }
        cursize += 4;
        st->pos += 4;
      }
    }
  }

  return cursize;
}